

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_ctx_close(nng_ctx c)

{
  int iVar1;
  nni_ctx *in_RAX;
  nni_ctx *local_18;
  nni_ctx *ctx;
  
  local_18 = in_RAX;
  iVar1 = nni_ctx_find(&local_18,c.id);
  if (iVar1 == 0) {
    nni_ctx_close(local_18);
  }
  return iVar1;
}

Assistant:

int
nng_ctx_close(nng_ctx c)
{
	int      rv;
	nni_ctx *ctx;

	if ((rv = nni_ctx_find(&ctx, c.id)) != 0) {
		return (rv);
	}
	// no release, close releases implicitly.
	nni_ctx_close(ctx);
	return (0);
}